

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.h
# Opt level: O2

void __thiscall midi_container::limit_port_number<unsigned_char>(midi_container *this,uchar *number)

{
  pointer puVar1;
  uint uVar2;
  
  puVar1 = (this->m_port_numbers).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = 0;
  while( true ) {
    if ((ulong)((long)(this->m_port_numbers).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1) <= (ulong)uVar2) {
      return;
    }
    if (puVar1[uVar2] == *number) break;
    uVar2 = uVar2 + 1;
  }
  *number = (uchar)uVar2;
  return;
}

Assistant:

void limit_port_number(T & number) const
    {
        for ( unsigned i = 0; i < m_port_numbers.size(); i++ )
        {
            if ( m_port_numbers[ i ] == number )
            {
                number = i;
                return;
            }
        }
    }